

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_branchi(dill_stream s,int op,int type,int src,long imm,int label)

{
  char **ppcVar1;
  char *pcVar2;
  uint rex;
  
  if ((uint)type < 0xb) {
    if ((0xaaU >> (type & 0x1fU) & 1) == 0) {
      if ((0x600U >> (type & 0x1fU) & 1) != 0) {
        x86_64_branchi_cold_1();
        return;
      }
    }
    else {
      op = op + 6;
    }
  }
  rex = (uint)(7 < src) | (uint)(type - 6U < 3) << 3;
  if ((ulong)imm < 0x7fffffff) {
    BYTE_OUT2IR(s,rex,0x81,src & 0xffU | 0xf8,(int)imm);
  }
  else {
    BYTE_OUT1LR(s,8,0xb8,imm);
    BYTE_OUT2R(s,rex,0x39,src & 7U | 0xc0);
  }
  dill_mark_branch_location(s,label);
  pcVar2 = s->p->cur_ip;
  if (s->p->code_limit <= pcVar2) {
    extend_dill_stream(s);
    pcVar2 = s->p->cur_ip;
  }
  *pcVar2 = '\x0f';
  s->p->cur_ip[1] = op_conds[op];
  pcVar2 = s->p->cur_ip;
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  ppcVar1 = &s->p->cur_ip;
  *ppcVar1 = *ppcVar1 + 6;
  return;
}

Assistant:

extern void
x86_64_branchi(dill_stream s,
               int op,
               int type,
               int src,
               IMM_TYPE imm,
               int label)
{
    int rex = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P))
        rex |= REX_W;

    switch (type) {
    case DILL_F:
    case DILL_D:
        fprintf(stderr, "Shouldn't happen\n");
        break;
    case DILL_U:
    case DILL_UL:
    case DILL_US:
    case DILL_UC:
        /*
                switch(op) {
                case dill_bge_code: {
                    imm = imm-1;
                    op = dill_bgt_code;
                    break;
                }
                case dill_blt_code: {
                    imm = imm-1;
                    op = dill_ble_code;
                    break;
                }
                }
        */
        op += 6; /* second set of codes */
                 /* fall through */
    default:
        /*	BYTE_OUT2(s, 0x39, ModRM(0x3, src2, src1));*/
        if (src > RDI)
            rex |= REX_B;
        if (((uintptr_t)imm) < 0x7fffffff) {
            BYTE_OUT2IR(s, rex, 0x81, ModRM(0x3, 0x7, src), (int)imm); /* cmp */
        } else {
            x86_64_setl(s, EAX, imm);
            BYTE_OUT2R(s, rex, 0x39, ModRM(0x3, EAX, src));
        }
        dill_mark_branch_location(s, label);
        BYTE_OUT2I(s, 0x0f, op_conds[op], 0);
    }
}